

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O1

void __thiscall DPolyobjInterpolation::Restore(DPolyobjInterpolation *this)

{
  double dVar1;
  FPolyObj *this_00;
  vertex_t **ppvVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  
  this_00 = this->poly;
  uVar5 = (ulong)(this_00->Vertices).Count;
  if (uVar5 != 0) {
    ppvVar2 = (this_00->Vertices).Array;
    pdVar3 = (this->bakverts).Array;
    uVar6 = 0;
    do {
      pdVar4 = *(double **)((long)ppvVar2 + uVar6 * 4);
      dVar1 = pdVar3[(int)uVar6 + 1];
      *pdVar4 = pdVar3[uVar6 & 0xffffffff];
      pdVar4[1] = dVar1;
      uVar6 = uVar6 + 2;
    } while (uVar5 * 2 != uVar6);
  }
  (this_00->CenterSpot).pos.X = this->bakcx;
  (this_00->CenterSpot).pos.Y = this->bakcy;
  FPolyObj::ClearSubsectorLinks(this_00);
  return;
}

Assistant:

void DPolyobjInterpolation::Restore()
{
	for(unsigned int i = 0; i < poly->Vertices.Size(); i++)
	{
		poly->Vertices[i]->set(bakverts[i*2  ], bakverts[i*2+1]);
	}
	poly->CenterSpot.pos.X = bakcx;
	poly->CenterSpot.pos.Y = bakcy;
	poly->ClearSubsectorLinks();
}